

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_24::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string_view ns,string_view el,Span<const_int> path,
          Message *orig_opt,Message *opt)

{
  iterator __first;
  iterator __last;
  allocator<int> local_4e;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  Message *local_38;
  Message *orig_opt_local;
  OptionsToInterpret *this_local;
  string_view el_local;
  string_view ns_local;
  
  el_local._M_len = (size_t)el._M_str;
  this_local = (OptionsToInterpret *)el._M_len;
  el_local._M_str = (char *)ns._M_len;
  local_38 = orig_opt;
  orig_opt_local = (Message *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&el_local._M_str,
             &local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->element_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,local_4d);
  std::allocator<char>::~allocator(local_4d);
  __first = absl::lts_20250127::Span<const_int>::begin(&path);
  __last = absl::lts_20250127::Span<const_int>::end(&path);
  std::allocator<int>::allocator(&local_4e);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->element_path,__first,__last,&local_4e);
  std::allocator<int>::~allocator(&local_4e);
  this->original_options = local_38;
  this->options = opt;
  return;
}

Assistant:

OptionsToInterpret(absl::string_view ns, absl::string_view el,
                     absl::Span<const int> path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path.begin(), path.end()),
        original_options(orig_opt),
        options(opt) {}